

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

uint64_t * shuff_med3(uint64_t *a,uint64_t *b,uint64_t *c,uint64_t *freq)

{
  int64_t iVar1;
  uint64_t *in_RCX;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t *local_48;
  uint64_t *local_40;
  uint64_t *local_38;
  uint64_t *local_30;
  uint64_t *local_28;
  
  iVar1 = shuff_cmp(in_RDI,in_RSI,in_RCX);
  if (iVar1 < 0) {
    iVar1 = shuff_cmp(in_RSI,in_RDX,in_RCX);
    local_28 = in_RSI;
    if (-1 < iVar1) {
      iVar1 = shuff_cmp(in_RDI,in_RDX,in_RCX);
      local_30 = in_RDI;
      if (iVar1 < 0) {
        local_30 = in_RDX;
      }
      local_28 = local_30;
    }
    local_38 = local_28;
  }
  else {
    iVar1 = shuff_cmp(in_RSI,in_RDX,in_RCX);
    local_40 = in_RSI;
    if (iVar1 < 1) {
      iVar1 = shuff_cmp(in_RDI,in_RDX,in_RCX);
      local_48 = in_RDX;
      if (iVar1 < 0) {
        local_48 = in_RDI;
      }
      local_40 = local_48;
    }
    local_38 = local_40;
  }
  return local_38;
}

Assistant:

uint64_t* shuff_med3(uint64_t* a, uint64_t* b, uint64_t* c, uint64_t freq[])
{
    return shuff_cmp(a, b, freq) < 0
        ? (shuff_cmp(b, c, freq) < 0 ? b : (shuff_cmp(a, c, freq) < 0 ? c : a))
        : (shuff_cmp(b, c, freq) > 0 ? b : (shuff_cmp(a, c, freq) < 0 ? a : c));
}